

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_frame_codec.c
# Opt level: O0

int amqp_frame_codec_encode_frame
              (AMQP_FRAME_CODEC_HANDLE amqp_frame_codec,uint16_t channel,AMQP_VALUE performative,
              PAYLOAD *payloads,size_t payload_count,ON_BYTES_ENCODED on_bytes_encoded,
              void *callback_context)

{
  undefined1 auVar1 [16];
  int iVar2;
  LOGGER_LOG p_Var3;
  uchar *__ptr;
  PAYLOAD *payloads_00;
  size_t local_e0;
  size_t local_d8;
  code *local_d0;
  LOGGER_LOG l_8;
  LOGGER_LOG p_Stack_b8;
  uchar channel_bytes [2];
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  size_t calloc_size;
  PAYLOAD *new_payloads;
  LOGGER_LOG l_5;
  uchar *amqp_performative_bytes;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t encoded_size;
  uint64_t performative_ulong;
  AMQP_VALUE descriptor;
  LOGGER_LOG l;
  ON_BYTES_ENCODED p_Stack_40;
  int result;
  ON_BYTES_ENCODED on_bytes_encoded_local;
  size_t payload_count_local;
  PAYLOAD *payloads_local;
  AMQP_VALUE performative_local;
  AMQP_FRAME_CODEC_HANDLE pAStack_18;
  uint16_t channel_local;
  AMQP_FRAME_CODEC_HANDLE amqp_frame_codec_local;
  
  p_Stack_40 = on_bytes_encoded;
  on_bytes_encoded_local = (ON_BYTES_ENCODED)payload_count;
  payload_count_local = (size_t)payloads;
  payloads_local = (PAYLOAD *)performative;
  performative_local._6_2_ = channel;
  pAStack_18 = amqp_frame_codec;
  if (((amqp_frame_codec == (AMQP_FRAME_CODEC_HANDLE)0x0) || (performative == (AMQP_VALUE)0x0)) ||
     (on_bytes_encoded == (ON_BYTES_ENCODED)0x0)) {
    descriptor = (AMQP_VALUE)xlogging_get_log_function();
    if (descriptor != (AMQP_VALUE)0x0) {
      (*(code *)descriptor)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                 ,"amqp_frame_codec_encode_frame",0xe7,1,
                 "Bad arguments: amqp_frame_codec = %p, performative = %p, on_bytes_encoded = %p",
                 pAStack_18,payloads_local,p_Stack_40);
    }
    l._4_4_ = 0xe8;
  }
  else {
    performative_ulong = (uint64_t)amqpvalue_get_inplace_descriptor(performative);
    if ((AMQP_VALUE)performative_ulong == (AMQP_VALUE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                  ,"amqp_frame_codec_encode_frame",0xf3,1,"Getting the descriptor failed");
      }
      l._4_4_ = 0xf4;
    }
    else {
      iVar2 = amqpvalue_get_ulong((AMQP_VALUE)performative_ulong,&encoded_size);
      if (iVar2 == 0) {
        if ((encoded_size < 0x10) || (0x18 < encoded_size)) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                      ,"amqp_frame_codec_encode_frame",0x102,1,
                      "Bad arguments: amqp_frame_codec = %p, performative = %p, on_bytes_encoded = %p"
                      ,pAStack_18,payloads_local,p_Stack_40);
          }
          l._4_4_ = 0x103;
        }
        else {
          iVar2 = amqpvalue_get_encoded_size((AMQP_VALUE)payloads_local,(size_t *)&l_1);
          if (iVar2 == 0) {
            __ptr = (uchar *)malloc((size_t)l_1);
            if (__ptr == (uchar *)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                          ,"amqp_frame_codec_encode_frame",0x111,1,
                          "Could not allocate performative bytes");
              }
              l._4_4_ = 0x112;
            }
            else {
              if (on_bytes_encoded_local < (ON_BYTES_ENCODED)0xfffffffffffffffe) {
                local_d0 = on_bytes_encoded_local + 1;
              }
              else {
                local_d0 = (code *)0xffffffffffffffff;
              }
              if (local_d0 == (code *)0x0) {
                local_d8 = 0;
              }
              else {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = local_d0;
                if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 0x10) {
                  local_e0 = 0xffffffffffffffff;
                }
                else {
                  local_e0 = (long)local_d0 << 4;
                }
                local_d8 = local_e0;
              }
              if ((local_d8 == 0xffffffffffffffff) ||
                 (payloads_00 = (PAYLOAD *)calloc(1,local_d8), payloads_00 == (PAYLOAD *)0x0)) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                            ,"amqp_frame_codec_encode_frame",0x11c,1,
                            "Could not allocate frame payloads, size:%zu",local_d8);
                }
                l._4_4_ = 0x11d;
              }
              else {
                payloads_00->bytes = __ptr;
                payloads_00->length = 0;
                if (on_bytes_encoded_local != (ON_BYTES_ENCODED)0x0) {
                  memcpy(payloads_00 + 1,(void *)payload_count_local,
                         (long)on_bytes_encoded_local << 4);
                }
                iVar2 = amqpvalue_encode((AMQP_VALUE)payloads_local,encode_bytes,payloads_00);
                if (iVar2 == 0) {
                  l_8._6_1_ = (undefined1)(performative_local._6_2_ >> 8);
                  l_8._7_1_ = (undefined1)performative_local._6_2_;
                  iVar2 = frame_codec_encode_frame
                                    (pAStack_18->frame_codec,'\0',payloads_00,
                                     (size_t)(on_bytes_encoded_local + 1),(uchar *)((long)&l_8 + 6),
                                     2,p_Stack_40,callback_context);
                  if (iVar2 == 0) {
                    l._4_4_ = 0;
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                                ,"amqp_frame_codec_encode_frame",0x13d,1,
                                "frame_codec_encode_frame failed");
                    }
                    l._4_4_ = 0x13e;
                  }
                }
                else {
                  p_Stack_b8 = xlogging_get_log_function();
                  if (p_Stack_b8 != (LOGGER_LOG)0x0) {
                    (*p_Stack_b8)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                                  ,"amqp_frame_codec_encode_frame",0x12d,1,"amqpvalue_encode failed"
                                 );
                  }
                  l._4_4_ = 0x12e;
                }
                free(payloads_00);
              }
              free(__ptr);
            }
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                        ,"amqp_frame_codec_encode_frame",0x109,1,"Getting the encoded size failed");
            }
            l._4_4_ = 0x10a;
          }
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                    ,"amqp_frame_codec_encode_frame",0xf9,1,"Getting the descriptor ulong failed");
        }
        l._4_4_ = 0xfa;
      }
    }
  }
  return l._4_4_;
}

Assistant:

int amqp_frame_codec_encode_frame(AMQP_FRAME_CODEC_HANDLE amqp_frame_codec, uint16_t channel, AMQP_VALUE performative, const PAYLOAD* payloads, size_t payload_count, ON_BYTES_ENCODED on_bytes_encoded, void* callback_context)
{
    int result;

    /* Codes_SRS_AMQP_FRAME_CODEC_01_024: [If frame_codec, performative or on_bytes_encoded is NULL, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
    if ((amqp_frame_codec == NULL) ||
        (performative == NULL) ||
        (on_bytes_encoded == NULL))
    {
        LogError("Bad arguments: amqp_frame_codec = %p, performative = %p, on_bytes_encoded = %p",
            amqp_frame_codec, performative, on_bytes_encoded);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE descriptor;
        uint64_t performative_ulong;
        size_t encoded_size;

        if ((descriptor = amqpvalue_get_inplace_descriptor(performative)) == NULL)
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Getting the descriptor failed");
            result = MU_FAILURE;
        }
        else if (amqpvalue_get_ulong(descriptor, &performative_ulong) != 0)
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Getting the descriptor ulong failed");
            result = MU_FAILURE;
        }
        /* Codes_SRS_AMQP_FRAME_CODEC_01_008: [The performative MUST be one of those defined in section 2.7 and is encoded as a described type in the AMQP type system.] */
        else if ((performative_ulong < AMQP_OPEN) ||
            (performative_ulong > AMQP_CLOSE))
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Bad arguments: amqp_frame_codec = %p, performative = %p, on_bytes_encoded = %p",
                amqp_frame_codec, performative, on_bytes_encoded);
            result = MU_FAILURE;
        }
        /* Codes_SRS_AMQP_FRAME_CODEC_01_027: [The encoded size of the performative and its fields shall be obtained by calling amqpvalue_get_encoded_size.] */
        else if (amqpvalue_get_encoded_size(performative, &encoded_size) != 0)
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Getting the encoded size failed");
            result = MU_FAILURE;
        }
        else
        {
            unsigned char* amqp_performative_bytes = (unsigned char*)malloc(encoded_size);
            if (amqp_performative_bytes == NULL)
            {
                LogError("Could not allocate performative bytes");
                result = MU_FAILURE;
            }
            else
            {
                PAYLOAD* new_payloads;
                size_t calloc_size = safe_add_size_t(payload_count, 1);
                calloc_size = safe_multiply_size_t(calloc_size, sizeof(PAYLOAD));
                if (calloc_size == SIZE_MAX ||
                    (new_payloads = (PAYLOAD*)calloc(1, calloc_size)) == NULL)
                {
                    LogError("Could not allocate frame payloads, size:%zu", calloc_size);
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_070: [The payloads argument for frame_codec_encode_frame shall be made of the payload for the encoded performative and the payloads passed to amqp_frame_codec_encode_frame.] */
                    /* Codes_SRS_AMQP_FRAME_CODEC_01_028: [The encode result for the performative shall be placed in a PAYLOAD structure.] */
                    new_payloads[0].bytes = amqp_performative_bytes;
                    new_payloads[0].length = 0;

                    if (payload_count > 0)
                    {
                        (void)memcpy(new_payloads + 1, payloads, sizeof(PAYLOAD) * payload_count);
                    }

                    if (amqpvalue_encode(performative, encode_bytes, &new_payloads[0]) != 0)
                    {
                        LogError("amqpvalue_encode failed");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        unsigned char channel_bytes[2];

                        channel_bytes[0] = channel >> 8;
                        channel_bytes[1] = channel & 0xFF;

                        /* Codes_SRS_AMQP_FRAME_CODEC_01_005: [Bytes 6 and 7 of an AMQP frame contain the channel number ] */
                        /* Codes_SRS_AMQP_FRAME_CODEC_01_025: [amqp_frame_codec_encode_frame shall encode the frame header by using frame_codec_encode_frame.] */
                        /* Codes_SRS_AMQP_FRAME_CODEC_01_006: [The frame body is defined as a performative followed by an opaque payload.] */
                        if (frame_codec_encode_frame(amqp_frame_codec->frame_codec, FRAME_TYPE_AMQP, new_payloads, payload_count + 1, channel_bytes, sizeof(channel_bytes), on_bytes_encoded, callback_context) != 0)
                        {
                            /* Codes_SRS_AMQP_FRAME_CODEC_01_029: [If any error occurs during encoding, amqp_frame_codec_encode_frame shall fail and return a non-zero value.] */
                            LogError("frame_codec_encode_frame failed");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            /* Codes_SRS_AMQP_FRAME_CODEC_01_022: [amqp_frame_codec_begin_encode_frame shall encode the frame header and AMQP performative in an AMQP frame and on success it shall return 0.] */
                            result = 0;
                        }
                    }

                    free(new_payloads);
                }

                free(amqp_performative_bytes);
            }
        }
    }

    return result;
}